

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::Sequencer::run(Sequencer *this,Hardware *hw,uint32_t cycles)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = Timer::run(&this->mTimer,cycles);
  if (!bVar2) {
    return;
  }
  lVar3 = (ulong)this->mTriggerIndex * 0xc;
  iVar1 = *(int *)(TRIGGER_SEQUENCE + lVar3 + 8);
  if (iVar1 == 2) {
    Hardware::clockEnvelopes(hw);
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0) goto LAB_0017d304;
      Hardware::clockSweep(hw);
    }
    Hardware::clockLengthCounters(hw);
  }
LAB_0017d304:
  *(ulong *)&(this->mTimer).mPeriod =
       CONCAT44((int)*(undefined8 *)(TRIGGER_SEQUENCE + lVar3),
                (int)((ulong)*(undefined8 *)(TRIGGER_SEQUENCE + lVar3) >> 0x20));
  return;
}

Assistant:

void Sequencer::run(Hardware &hw, uint32_t cycles) noexcept {
    if (mTimer.run(cycles)) {
        Trigger const &trigger = TRIGGER_SEQUENCE[mTriggerIndex];
        switch (trigger.type) {
            case TriggerType::lcSweep:
                hw.clockSweep();
                [[fallthrough]];
            case TriggerType::lc:
                hw.clockLengthCounters();
                break;
            case TriggerType::env:
                hw.clockEnvelopes();
                break;
        }
        mTimer.setPeriod(trigger.nextPeriod);
        mTriggerIndex = trigger.nextIndex;
    }
}